

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeoutMonitor.cpp
# Opt level: O0

void __thiscall helics::TimeoutMonitor::tick(TimeoutMonitor *this,CoreBroker *brk)

{
  bool bVar1;
  BrokerState BVar2;
  CoreBroker *in_RSI;
  long in_RDI;
  ActionMessage png_4;
  ActionMessage png_3;
  ActionMessage png_2;
  ActionMessage png_1;
  ActionMessage cerror;
  linkConnection *conn;
  iterator __end1;
  iterator __begin1;
  vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *__range1;
  ActionMessage png;
  time_point now;
  bool waiting;
  ActionMessage *in_stack_fffffffffffff968;
  CoreBroker *in_stack_fffffffffffff970;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffff978;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff988;
  action_t aVar3;
  ActionMessage *in_stack_fffffffffffff990;
  ActionMessage *this_00;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffff998;
  GlobalFederateId local_62c [3];
  BaseType local_620;
  int in_stack_fffffffffffffa3c;
  CoreBroker *in_stack_fffffffffffffa40;
  action_t in_stack_fffffffffffffa5c;
  CoreBroker *in_stack_fffffffffffffa60;
  __unspec local_569;
  rep local_568;
  type local_559;
  BaseType local_558;
  GlobalFederateId local_554;
  undefined1 local_550 [8];
  BaseType local_548;
  undefined1 in_stack_fffffffffffffacb;
  int in_stack_fffffffffffffacc;
  BrokerBase *in_stack_fffffffffffffad0;
  string_view in_stack_fffffffffffffad8;
  GlobalFederateId in_stack_fffffffffffffaec;
  __unspec local_491;
  rep local_490;
  type local_485;
  undefined4 local_484;
  BaseType local_480;
  GlobalFederateId local_47c;
  undefined4 in_stack_fffffffffffffb88;
  GlobalFederateId in_stack_fffffffffffffb8c;
  TimeoutMonitor *in_stack_fffffffffffffb90;
  string_view in_stack_fffffffffffffc10;
  GlobalFederateId local_3ac;
  duration<long,_std::ratio<1L,_1000000000L>_> local_3a8;
  BaseType local_3a0;
  BaseType local_398;
  BaseType local_2f0;
  GlobalFederateId local_2ec [3];
  BaseType local_2e0;
  BaseType local_2d8;
  __unspec local_229;
  rep local_228;
  type local_219;
  reference local_218;
  linkConnection *local_210;
  __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
  local_208;
  long local_200;
  undefined4 local_1f4;
  BaseType local_1f0;
  GlobalFederateId local_1ec;
  BaseType local_1e8;
  GlobalFederateId local_1e4;
  undefined1 local_1e0 [8];
  BaseType local_1d8;
  BaseType local_1d0;
  ActionMessage *local_60;
  CoreBroker *pCStack_58;
  __sv_type local_50;
  BaseType local_3c;
  GlobalFederateId local_38;
  __unspec local_31;
  rep local_30;
  type local_21;
  undefined8 local_20;
  byte local_11;
  CoreBroker *local_10;
  
  local_11 = *(byte *)(in_RDI + 0x18) & 1;
  local_10 = in_RSI;
  local_20 = std::chrono::_V2::steady_clock::now();
  bVar1 = CoreBroker::isRoot((CoreBroker *)0x599bba);
  if ((!bVar1) && ((*(byte *)(in_RDI + 0x18) & 1) != 0)) {
    local_30 = (rep)std::chrono::operator-
                              (in_stack_fffffffffffff978,
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)in_stack_fffffffffffff970);
    local_21 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                               (in_stack_fffffffffffff998,
                                (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff990)
    ;
    CLI::std::__cmp_cat::__unspec::__unspec(&local_31,(__unspec *)0x0);
    bVar1 = std::operator>(local_21);
    if (bVar1) {
      local_3c = (local_10->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(&local_38,(GlobalBrokerId)local_3c);
      CoreBroker::getIdentifier_abi_cxx11_(local_10);
      local_50 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff970);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffff980,(char *)in_stack_fffffffffffff978);
      BrokerBase::sendToLogger
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffaec,in_stack_fffffffffffffacc,
                 in_stack_fffffffffffffad8,in_stack_fffffffffffffc10,(bool)in_stack_fffffffffffffacb
                );
      CoreBroker::sendErrorToImmediateBrokers(in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c);
      CoreBroker::sendDisconnect(in_stack_fffffffffffffa60,in_stack_fffffffffffffa5c);
      CLI::std::atomic<helics::BrokerBase::BrokerState>::operator=
                ((atomic<helics::BrokerBase::BrokerState> *)pCStack_58,
                 (BrokerState)((ulong)local_60 >> 0x30));
      ActionMessage::ActionMessage
                (in_stack_fffffffffffff990,(action_t)((ulong)in_stack_fffffffffffff988 >> 0x20));
      BrokerBase::addActionMessage((BrokerBase *)pCStack_58,local_60);
      ActionMessage::~ActionMessage((ActionMessage *)pCStack_58);
      in_stack_fffffffffffff968 = local_60;
      in_stack_fffffffffffff970 = pCStack_58;
    }
    else {
      ActionMessage::ActionMessage
                (in_stack_fffffffffffff990,(action_t)((ulong)in_stack_fffffffffffff988 >> 0x20));
      local_1e8 = (local_10->super_BrokerBase).global_broker_id_local.gid;
      GlobalFederateId::GlobalFederateId(&local_1e4,(GlobalBrokerId)local_1e8);
      local_1d8 = local_1e4.gid;
      local_1f0 = (local_10->super_BrokerBase).higher_broker_id.gid;
      GlobalFederateId::GlobalFederateId(&local_1ec,(GlobalBrokerId)local_1f0);
      local_1d0 = local_1ec.gid;
      local_1f4 = 0;
      (*(local_10->super_Broker)._vptr_Broker[0x22])(local_10,0,local_1e0);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff970);
    }
  }
  local_200 = in_RDI + 0x28;
  local_208._M_current =
       (linkConnection *)
       std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::begin
                 ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                  in_stack_fffffffffffff968);
  local_210 = (linkConnection *)
              std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>::end
                        ((vector<helics::linkConnection,_std::allocator<helics::linkConnection>_> *)
                         in_stack_fffffffffffff968);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                      ((__normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                        *)in_stack_fffffffffffff970,
                       (__normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                        *)in_stack_fffffffffffff968);
    aVar3 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_218 = __gnu_cxx::
                __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
                ::operator*(&local_208);
    if ((local_218->waitingForPingReply & 1U) != 0) {
      local_11 = 1;
      local_228 = (rep)std::chrono::operator-
                                 (in_stack_fffffffffffff978,
                                  (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)in_stack_fffffffffffff970);
      local_219 = (type)std::chrono::
                        operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                  (in_stack_fffffffffffff998,
                                   (duration<long,_std::ratio<1L,_1000L>_> *)
                                   in_stack_fffffffffffff990);
      CLI::std::__cmp_cat::__unspec::__unspec(&local_229,(__unspec *)0x0);
      bVar1 = std::operator>(local_219);
      aVar3 = (action_t)((ulong)in_stack_fffffffffffff988 >> 0x20);
      if (bVar1) {
        ActionMessage::ActionMessage(in_stack_fffffffffffff990,aVar3);
        local_2f0 = (local_10->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(local_2ec,(GlobalBrokerId)local_2f0);
        local_2d8 = local_2ec[0].gid;
        local_2e0 = (local_218->connection).gid;
        BrokerBase::addActionMessage
                  ((BrokerBase *)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff970);
      }
      else {
        in_stack_fffffffffffff998 = &local_3a8;
        ActionMessage::ActionMessage(in_stack_fffffffffffff990,aVar3);
        GlobalFederateId::GlobalFederateId
                  (&local_3ac,
                   (GlobalBrokerId)(local_10->super_BrokerBase).global_broker_id_local.gid);
        local_3a0 = local_3ac.gid;
        local_398 = (local_218->connection).gid;
        BrokerBase::addActionMessage
                  ((BrokerBase *)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff970);
      }
    }
    __gnu_cxx::
    __normal_iterator<helics::linkConnection_*,_std::vector<helics::linkConnection,_std::allocator<helics::linkConnection>_>_>
    ::operator++(&local_208);
  }
  if ((local_11 & 1) == 0) {
    bVar1 = CoreBroker::isRoot((CoreBroker *)0x59a0d6);
    if (bVar1) {
      pingSub(in_stack_fffffffffffffb90,
              (CoreBroker *)CONCAT44(in_stack_fffffffffffffb8c.gid,in_stack_fffffffffffffb88));
    }
    else {
      bVar1 = CoreBroker::isConnected(in_stack_fffffffffffff970);
      if (((bVar1) &&
          (bVar1 = GlobalBrokerId::isValid(&(local_10->super_BrokerBase).global_broker_id_local),
          bVar1)) &&
         (bVar1 = GlobalBrokerId::operator!=
                            (&(local_10->super_BrokerBase).global_broker_id_local,
                             (GlobalBrokerId)0x0), bVar1)) {
        bVar1 = GlobalBrokerId::isValid(&(local_10->super_BrokerBase).higher_broker_id);
        if (bVar1) {
          this_00 = (ActionMessage *)&stack0xfffffffffffffb90;
          ActionMessage::ActionMessage(this_00,aVar3);
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffb8c,
                     (GlobalBrokerId)(local_10->super_BrokerBase).global_broker_id_local.gid);
          local_480 = (local_10->super_BrokerBase).higher_broker_id.gid;
          GlobalFederateId::GlobalFederateId(&local_47c,(GlobalBrokerId)local_480);
          local_484 = 0;
          (*(local_10->super_Broker)._vptr_Broker[0x22])(local_10,0,this_00);
          *(undefined8 *)(in_RDI + 0x20) = local_20;
          *(undefined1 *)(in_RDI + 0x18) = 1;
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff970);
        }
      }
      else {
        BVar2 = std::atomic::operator_cast_to_BrokerState
                          ((atomic<helics::BrokerBase::BrokerState> *)0x59a275);
        if ((BVar2 == TERMINATED) ||
           (BVar2 = std::atomic::operator_cast_to_BrokerState
                              ((atomic<helics::BrokerBase::BrokerState> *)0x59a293),
           BVar2 == ERRORED)) {
          if ((*(byte *)(in_RDI + 8) & 1) == 0) {
            *(undefined1 *)(in_RDI + 8) = 1;
            *(undefined8 *)(in_RDI + 0x10) = local_20;
          }
          else {
            local_490 = (rep)std::chrono::operator-
                                       (in_stack_fffffffffffff978,
                                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                         *)in_stack_fffffffffffff970);
            local_485 = (type)std::chrono::
                              operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                        (in_stack_fffffffffffff998,
                                         (duration<long,_std::ratio<1L,_1000L>_> *)
                                         in_stack_fffffffffffff990);
            CLI::std::__cmp_cat::__unspec::__unspec(&local_491,(__unspec *)0x0);
            bVar1 = std::operator>(local_485);
            if (bVar1) {
              ActionMessage::ActionMessage
                        (in_stack_fffffffffffff990,(action_t)((ulong)local_550 >> 0x20));
              local_558 = (local_10->super_BrokerBase).global_broker_id_local.gid;
              GlobalFederateId::GlobalFederateId(&local_554,(GlobalBrokerId)local_558);
              local_548 = local_554.gid;
              BrokerBase::addActionMessage
                        ((BrokerBase *)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
              ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff970);
            }
          }
        }
        else if ((*(byte *)(in_RDI + 8) & 1) == 0) {
          *(undefined1 *)(in_RDI + 8) = 1;
          *(undefined8 *)(in_RDI + 0x10) = local_20;
        }
        else {
          local_568 = (rep)std::chrono::operator-
                                     (in_stack_fffffffffffff978,
                                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)in_stack_fffffffffffff970);
          local_559 = (type)std::chrono::
                            operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000L>_>
                                      (in_stack_fffffffffffff998,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       in_stack_fffffffffffff990);
          CLI::std::__cmp_cat::__unspec::__unspec(&local_569,(__unspec *)0x0);
          bVar1 = std::operator>(local_559);
          if (bVar1) {
            ActionMessage::ActionMessage(in_stack_fffffffffffff990,aVar3);
            GlobalFederateId::GlobalFederateId
                      (local_62c,
                       (GlobalBrokerId)(local_10->super_BrokerBase).global_broker_id_local.gid);
            local_620 = local_62c[0].gid;
            BrokerBase::addActionMessage
                      ((BrokerBase *)in_stack_fffffffffffff970,in_stack_fffffffffffff968);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff970);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TimeoutMonitor::tick(CoreBroker* brk)
{
    // check the connections

    bool waiting = parentConnection.waitingForPingReply;
    auto now = std::chrono::steady_clock::now();

    if (!brk->isRoot() && parentConnection.waitingForPingReply) {
        if (now - parentConnection.lastPing > timeout) {
            // try to reset the connection to the broker
            // brokerReconnect()
            brk->sendToLogger(brk->global_broker_id_local,
                              LogLevels::ERROR_LEVEL,
                              brk->getIdentifier(),
                              "broker lost connection with parent");
            brk->sendErrorToImmediateBrokers(-5);
            brk->sendDisconnect(CMD_GLOBAL_DISCONNECT);
            brk->brokerState = BrokerBase::BrokerState::ERRORED;
            brk->addActionMessage(CMD_STOP);
        } else {  // ping again
            ActionMessage png(CMD_PING_PRIORITY);
            png.source_id = brk->global_broker_id_local;
            png.dest_id = brk->higher_broker_id;
            brk->transmit(parent_route_id, png);
        }
    }

    for (auto& conn : connections) {
        if (conn.waitingForPingReply) {
            waiting = true;
            if (now - conn.lastPing > timeout) {
                ActionMessage cerror(CMD_CONNECTION_ERROR);
                cerror.dest_id = brk->global_broker_id_local;
                cerror.source_id = conn.connection;
                brk->addActionMessage(cerror);
            } else {  // ping again
                ActionMessage png(CMD_PING);
                png.source_id = brk->global_broker_id_local;
                png.dest_id = conn.connection;
                brk->addActionMessage(png);
            }
        }
    }
    if (!waiting) {
        if (!brk->isRoot()) {
            if ((brk->isConnected()) && (brk->global_broker_id_local.isValid()) &&
                (brk->global_broker_id_local != parent_broker_id)) {
                // if (allFedWaiting())
                //{
                if (brk->higher_broker_id.isValid()) {
                    ActionMessage png(CMD_PING_PRIORITY);
                    png.source_id = brk->global_broker_id_local;
                    png.dest_id = brk->higher_broker_id;
                    brk->transmit(parent_route_id, png);
                    parentConnection.lastPing = now;
                    parentConnection.waitingForPingReply = true;
                }
                //}
            } else if ((brk->brokerState == BrokerBase::BrokerState::TERMINATED) ||
                       (brk->brokerState == BrokerBase::BrokerState::ERRORED)) {
                if (waitingForConnection) {
                    if (now - startWaiting > timeout) {
                        ActionMessage png(CMD_CHECK_CONNECTIONS);
                        png.source_id = brk->global_broker_id_local;
                        brk->addActionMessage(png);
                    }
                } else {
                    waitingForConnection = true;
                    startWaiting = now;
                }
            } else {
                if (waitingForConnection) {
                    if (now - startWaiting > timeout) {
                        ActionMessage png(CMD_CHECK_CONNECTIONS);
                        png.source_id = brk->global_broker_id_local;
                        brk->addActionMessage(png);
                    }
                } else {
                    waitingForConnection = true;
                    startWaiting = now;
                }
            }
        } else {  // brk is a root broker
            pingSub(brk);
        }
    }
}